

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::TreeEnsembleRegressor::ByteSizeLong(TreeEnsembleRegressor *this)

{
  bool bVar1;
  TreeEnsemblePostEvaluationTransform TVar2;
  int iVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  TreeEnsembleRegressor *this_local;
  
  sStack_18 = 0;
  bVar1 = has_treeensemble(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleParameters>
                          (this->treeensemble_);
    sStack_18 = sStack_18 + 1;
  }
  TVar2 = postevaluationtransform(this);
  if (TVar2 != NoTransform) {
    TVar2 = postevaluationtransform(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(TVar2);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t TreeEnsembleRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleRegressor)
  size_t total_size = 0;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->has_treeensemble()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->treeensemble_);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}